

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSONValue * __thiscall JSON::JSONValue::operator=(JSONValue *this,JSONValue *v)

{
  longlong lVar1;
  string *s;
  JSONObject *o;
  double *pdVar2;
  JSONArray *r;
  longlong *plVar3;
  bool *pbVar4;
  undefined1 *puVar5;
  double dVar6;
  
  switch(v->type) {
  case STRING:
    s = getStringValue_abi_cxx11_(v);
    setStringValue(this,s);
    break;
  case INTEGER:
    plVar3 = getIntValue(v);
    lVar1 = *plVar3;
    delete_data(this);
    this->type = INTEGER;
    plVar3 = (longlong *)operator_new(8);
    this->data = plVar3;
    *plVar3 = lVar1;
    break;
  case DOUBLE:
    dVar6 = getDoubleValue(v);
    delete_data(this);
    this->type = DOUBLE;
    pdVar2 = (double *)operator_new(8);
    this->data = pdVar2;
    *pdVar2 = dVar6;
    break;
  case ARRAY:
    r = getArrayValue(v);
    setArrayValue(this,r);
    break;
  case OBJECT:
    o = getObjectValue(v);
    setObjectValue(this,o);
    break;
  case BOOLEAN:
    pbVar4 = getBoolValue(v);
    delete_data(this);
    this->type = BOOLEAN;
    puVar5 = (undefined1 *)operator_new(1);
    this->data = puVar5;
    *puVar5 = *pbVar4;
    break;
  case JSONNULL:
    delete_data(this);
    this->data = (void *)0x0;
    this->type = JSONNULL;
  }
  return this;
}

Assistant:

JSONValue &JSONValue::operator=(const JSONValue &v) {
	switch(v.getType()) {
		case STRING:
			setStringValue(v.getStringValue());
			break;
		case INTEGER:
			setIntValue(v.getIntValue());
			break;
		case DOUBLE:
			setDoubleValue(v.getDoubleValue());
			break;
		case ARRAY:
			setArrayValue(v.getArrayValue());
			break;
		case OBJECT:
			setObjectValue(v.getObjectValue());
			break;
		case BOOLEAN:
			setBoolValue(v.getBoolValue());
			break;
		case JSONNULL:
			setNull();
			break;
	}
	return *this;
}